

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

void __thiscall wasm::OptimizeInstructions::visitArraySet(OptimizeInstructions *this,ArraySet *curr)

{
  Expression **input;
  pointer pFVar1;
  bool bVar2;
  uint bytes;
  Struct *pSVar3;
  Type local_50;
  Field local_48;
  char local_38;
  HeapType local_28;
  
  input = &curr->ref;
  skipNonNullCast(this,input,(Expression *)curr);
  bVar2 = trapOnNull(this,(Expression *)curr,input);
  if (bVar2) {
    return;
  }
  if (((curr->value->type).id & 0xfffffffffffffffe) != 2) {
    return;
  }
  local_50.id = ((*input)->type).id;
  bVar2 = wasm::Type::isRef(&local_50);
  if (bVar2) {
    local_28 = wasm::Type::getHeapType(&local_50);
    bVar2 = HeapType::isStruct(&local_28);
    if (bVar2) {
      pSVar3 = HeapType::getStruct(&local_28);
      pFVar1 = (pSVar3->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_48.type.id = (pFVar1->type).id;
      local_48.packedType = pFVar1->packedType;
      local_48.mutable_ = pFVar1->mutable_;
    }
    else {
      bVar2 = HeapType::isArray(&local_28);
      if (!bVar2) {
        local_38 = '\0';
        goto LAB_007ff14e;
      }
      HeapType::getArray((HeapType *)&local_48);
    }
    local_38 = '\x01';
  }
  else {
    local_38 = '\0';
  }
LAB_007ff14e:
  if (local_38 == '\x01') {
    bytes = Field::getByteSize(&local_48);
    optimizeStoredValue(this,&curr->value,bytes);
  }
  return;
}

Assistant:

void visitArraySet(ArraySet* curr) {
    skipNonNullCast(curr->ref, curr);
    if (trapOnNull(curr, curr->ref)) {
      return;
    }

    if (curr->value->type.isInteger()) {
      if (auto field = GCTypeUtils::getField(curr->ref->type)) {
        optimizeStoredValue(curr->value, field->getByteSize());
      }
    }
  }